

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_k_tf.c
# Opt level: O3

void lda_k_tf_init(xc_func_type *p)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  long *plVar8;
  long lVar9;
  double *extraout_RDX;
  long lVar10;
  long in_RSI;
  long *plVar11;
  double *pdVar12;
  undefined8 uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  plVar11 = (long *)0x8;
  puVar7 = (undefined8 *)malloc(8);
  p->params = puVar7;
  uVar2 = p->info->number;
  plVar8 = (long *)(ulong)uVar2;
  if (uVar2 == 0x32) {
    uVar13 = 0x3ff1ade0a4f67432;
  }
  else {
    if (uVar2 != 0x33) {
      lda_k_tf_init_cold_1();
      if (in_RSI != 0) {
        lVar5 = plVar11[1];
        lVar6 = plVar11[9];
        lVar10 = 0;
        pdVar12 = extraout_RDX;
        do {
          dVar14 = *pdVar12;
          if ((int)lVar5 == 2) {
            dVar14 = dVar14 + pdVar12[1];
          }
          dVar1 = (double)plVar11[0x30];
          if (dVar1 <= dVar14) {
            dVar14 = *pdVar12;
            pdVar3 = (double *)plVar11[0x2f];
            dVar16 = (double)plVar11[0x31];
            dVar15 = 1.0;
            if (1.0 <= dVar16) {
              dVar15 = cbrt(dVar16);
              dVar15 = dVar15 * dVar15 * dVar16;
            }
            if (dVar14 <= dVar1) {
              dVar14 = dVar1;
            }
            dVar1 = *pdVar3;
            dVar16 = cbrt(0.3183098861837907);
            dVar14 = cbrt(dVar14);
            lVar4 = *plVar8;
            if ((lVar4 != 0) && ((*(byte *)(*plVar11 + 0x40) & 1) != 0)) {
              lVar9 = (int)plVar11[0xb] * lVar10;
              *(double *)(lVar4 + lVar9 * 8) =
                   (dVar14 * dVar14 *
                   (1.0 / (dVar16 * dVar16)) * 2.519842099789747 *
                   dVar15 * dVar1 * 1.4422495703074083) / 3.0 + *(double *)(lVar4 + lVar9 * 8);
            }
          }
          lVar10 = lVar10 + 1;
          pdVar12 = pdVar12 + (int)lVar6;
        } while (in_RSI != lVar10);
      }
      return;
    }
    uVar13 = 0x3ff247624737528c;
  }
  *puVar7 = uVar13;
  return;
}

Assistant:

static void
lda_k_tf_init(xc_func_type *p)
{
  lda_k_tf_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(lda_k_tf_params));
  params = (lda_k_tf_params *) (p->params);

  switch(p->info->number){
  case XC_LDA_K_TF:
    /* 3/10*(3*M_PI^2)^(2/3) * (3/4 pi)^(2/3) = 3/10*pow(9*M_PI/4, 2/3) */
    params->ax = 1.104950565705860002098832079519635692942;
    break;
  case XC_LDA_K_LP:
    /* 3*M_PI/2^(5/3) * (3/4 pi)^(2/3) = 3*M_PI*pow(3/(8*M_PI), 2/3)*/
    params->ax = 1.142427709758666675644309251677891925671;
    break;
  default:
    fprintf(stderr, "Internal error in lda_k_tf\n");
    exit(1);
  }
}